

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O0

Triangle * rasterize(Triangle *__return_storage_ptr__,Camera *camera,Triangle triangle)

{
  Vector projectionVec;
  Vector projectionVec_00;
  Vector projectionVec_01;
  Vector projectionVec_02;
  Vector projectionVec_03;
  Vector projectionVec_04;
  Vector projectionVec_05;
  Camera *pCVar1;
  Triangle *new;
  Vector local_2b8;
  Vector local_288;
  Vector local_258;
  Vector local_228;
  Vector local_1f8;
  Vector local_1c8;
  Vector local_198;
  Vector local_168;
  Vector local_138;
  Vector local_108;
  Vector local_d8;
  Vector local_a8;
  Vector local_78;
  Vector local_48;
  Camera *local_10;
  Camera *camera_local;
  
  local_10 = camera;
  memcpy(__return_storage_ptr__,&triangle,0x150);
  pCVar1 = local_10;
  WorldPos2NDCPos(&local_78,local_10,__return_storage_ptr__->vertexes[0]);
  projectionVec.x._8_8_ = local_78.x._8_8_;
  projectionVec.x._0_8_ = local_78.x._0_8_;
  projectionVec.y._0_8_ = local_78.y._0_8_;
  projectionVec.y._8_8_ = local_78.y._8_8_;
  projectionVec.z._0_8_ = local_78.z._0_8_;
  projectionVec.z._8_8_ = local_78.z._8_8_;
  NDCPos2ImagePos(&local_48,pCVar1,projectionVec);
  memcpy(__return_storage_ptr__->vertexes,&local_48,0x30);
  pCVar1 = local_10;
  WorldPos2NDCPos(&local_d8,local_10,__return_storage_ptr__->vertexes[1]);
  projectionVec_00.x._8_8_ = local_d8.x._8_8_;
  projectionVec_00.x._0_8_ = local_d8.x._0_8_;
  projectionVec_00.y._0_8_ = local_d8.y._0_8_;
  projectionVec_00.y._8_8_ = local_d8.y._8_8_;
  projectionVec_00.z._0_8_ = local_d8.z._0_8_;
  projectionVec_00.z._8_8_ = local_d8.z._8_8_;
  NDCPos2ImagePos(&local_a8,pCVar1,projectionVec_00);
  memcpy(__return_storage_ptr__->vertexes + 1,&local_a8,0x30);
  pCVar1 = local_10;
  WorldPos2NDCPos(&local_138,local_10,__return_storage_ptr__->vertexes[2]);
  projectionVec_01.x._8_8_ = local_138.x._8_8_;
  projectionVec_01.x._0_8_ = local_138.x._0_8_;
  projectionVec_01.y._0_8_ = local_138.y._0_8_;
  projectionVec_01.y._8_8_ = local_138.y._8_8_;
  projectionVec_01.z._0_8_ = local_138.z._0_8_;
  projectionVec_01.z._8_8_ = local_138.z._8_8_;
  NDCPos2ImagePos(&local_108,pCVar1,projectionVec_01);
  memcpy(__return_storage_ptr__->vertexes + 2,&local_108,0x30);
  pCVar1 = local_10;
  WorldPos2NDCPos(&local_198,local_10,__return_storage_ptr__->surfaceNormal);
  projectionVec_02.x._8_8_ = local_198.x._8_8_;
  projectionVec_02.x._0_8_ = local_198.x._0_8_;
  projectionVec_02.y._0_8_ = local_198.y._0_8_;
  projectionVec_02.y._8_8_ = local_198.y._8_8_;
  projectionVec_02.z._0_8_ = local_198.z._0_8_;
  projectionVec_02.z._8_8_ = local_198.z._8_8_;
  NDCPos2ImagePos(&local_168,pCVar1,projectionVec_02);
  memcpy(__return_storage_ptr__,&local_168,0x30);
  pCVar1 = local_10;
  WorldPos2NDCPos(&local_1f8,local_10,__return_storage_ptr__->vertexNormals[0]);
  projectionVec_03.x._8_8_ = local_1f8.x._8_8_;
  projectionVec_03.x._0_8_ = local_1f8.x._0_8_;
  projectionVec_03.y._0_8_ = local_1f8.y._0_8_;
  projectionVec_03.y._8_8_ = local_1f8.y._8_8_;
  projectionVec_03.z._0_8_ = local_1f8.z._0_8_;
  projectionVec_03.z._8_8_ = local_1f8.z._8_8_;
  NDCPos2ImagePos(&local_1c8,pCVar1,projectionVec_03);
  memcpy(__return_storage_ptr__->vertexNormals,&local_1c8,0x30);
  pCVar1 = local_10;
  WorldPos2NDCPos(&local_258,local_10,__return_storage_ptr__->vertexNormals[1]);
  projectionVec_04.x._8_8_ = local_258.x._8_8_;
  projectionVec_04.x._0_8_ = local_258.x._0_8_;
  projectionVec_04.y._0_8_ = local_258.y._0_8_;
  projectionVec_04.y._8_8_ = local_258.y._8_8_;
  projectionVec_04.z._0_8_ = local_258.z._0_8_;
  projectionVec_04.z._8_8_ = local_258.z._8_8_;
  NDCPos2ImagePos(&local_228,pCVar1,projectionVec_04);
  memcpy(__return_storage_ptr__->vertexNormals + 1,&local_228,0x30);
  pCVar1 = local_10;
  WorldPos2NDCPos(&local_2b8,local_10,__return_storage_ptr__->vertexNormals[2]);
  projectionVec_05.x._8_8_ = local_2b8.x._8_8_;
  projectionVec_05.x._0_8_ = local_2b8.x._0_8_;
  projectionVec_05.y._0_8_ = local_2b8.y._0_8_;
  projectionVec_05.y._8_8_ = local_2b8.y._8_8_;
  projectionVec_05.z._0_8_ = local_2b8.z._0_8_;
  projectionVec_05.z._8_8_ = local_2b8.z._8_8_;
  NDCPos2ImagePos(&local_288,pCVar1,projectionVec_05);
  memcpy(__return_storage_ptr__->vertexNormals + 2,&local_288,0x30);
  return __return_storage_ptr__;
}

Assistant:

Triangle rasterize(const Camera *camera, const Triangle triangle) {
  Triangle new = triangle;
  new.vertexes[0] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexes[0]));
  new.vertexes[1] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexes[1]));
  new.vertexes[2] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexes[2]));
  new.surfaceNormal = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.surfaceNormal));
  new.vertexNormals[0] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexNormals[0]));
  new.vertexNormals[1] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexNormals[1]));
  new.vertexNormals[2] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexNormals[2]));
  return new;
}